

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asynclog.cpp
# Opt level: O1

void __thiscall AsyncLog::Start(AsyncLog *this)

{
  LockGuard lock;
  LockGuard local_10;
  
  this->m_bRunning = true;
  Thread::Start(&this->m_thread);
  LockGuard::LockGuard
            (&local_10,
             (this->m_mutex)._M_t.super___uniq_ptr_impl<Mutex,_std::default_delete<Mutex>_>._M_t.
             super__Tuple_impl<0UL,_Mutex_*,_std::default_delete<Mutex>_>.
             super__Head_base<0UL,_Mutex_*,_false>._M_head_impl);
  Condition::Wait((this->m_mainThreadRunCond)._M_t.
                  super___uniq_ptr_impl<Condition,_std::default_delete<Condition>_>._M_t.
                  super__Tuple_impl<0UL,_Condition_*,_std::default_delete<Condition>_>.
                  super__Head_base<0UL,_Condition_*,_false>._M_head_impl);
  LockGuard::~LockGuard(&local_10);
  return;
}

Assistant:

void AsyncLog::Start()
{
	m_bRunning = true;
	m_thread.Start();
	LockGuard lock(*m_mutex);
	m_mainThreadRunCond->Wait();
	//std::cout << "Main thread Running " << __LINE__ << std::endl;
}